

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::MakeFn(VirtualMachine *this)

{
  pointer *ppCVar1;
  element_type *peVar2;
  pointer pFVar3;
  pointer pCVar4;
  pointer pCVar5;
  iterator __position;
  element_type *peVar6;
  StackFrame *pSVar7;
  anon_union_8_6_52c89740_for_Variable_1 this_00;
  Function *pFVar8;
  undefined8 uVar9;
  ClosureContext *closure;
  pointer closure_00;
  Variable v;
  undefined1 local_50 [32];
  
  pSVar7 = (StackFrame *)getByteCodeParameter(this);
  peVar2 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((StackFrame *)
      ((long)(peVar2->functions).
             super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(peVar2->functions).
             super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
             super__Vector_impl_data._M_start >> 6) <= pSVar7) {
    local_50._0_8_ = (StackFrame *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Index out of bounds in MakeFn","");
    panic(this,(string *)local_50);
  }
  this_00.functionValue = Heap::NewFunction(&this->heap);
  peVar2 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pFVar3 = (peVar2->functions).
           super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar7 < (StackFrame *)
               ((long)(peVar2->functions).
                      super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 6)) {
    pFVar8 = pFVar3 + (long)pSVar7;
    (this_00.functionValue)->fn = pFVar8;
    pCVar4 = (((_Vector_impl *)&((this_00.objectValue)->properties)._M_h._M_buckets)->
             super__Vector_impl_data)._M_start;
    if ((pointer)((this_00.objectValue)->properties)._M_h._M_bucket_count != pCVar4) {
      ((this_00.objectValue)->properties)._M_h._M_bucket_count = (size_type)pCVar4;
    }
    closure_00 = (pFVar8->closures).
                 super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pCVar5 = (pFVar8->closures).
             super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (closure_00 != pCVar5) {
      do {
        local_50._0_16_ = (undefined1  [16])loadClosure(this,closure_00);
        __position._M_current =
             ((this_00.functionValue)->captures).
             super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (ClosureContext *)((this_00.objectValue)->properties)._M_h._M_before_begin._M_nxt) {
          std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::
          _M_realloc_insert<runtime::ClosureContext>
                    ((vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_> *)
                     this_00.objectValue,__position,(ClosureContext *)local_50);
        }
        else {
          (__position._M_current)->stackFrame = (StackFrame *)local_50._0_8_;
          (__position._M_current)->scopeIndex = local_50._8_8_;
          ppCVar1 = (pointer *)&((this_00.objectValue)->properties)._M_h._M_bucket_count;
          *ppCVar1 = *ppCVar1 + 1;
        }
        closure_00 = closure_00 + 1;
      } while (closure_00 != pCVar5);
    }
    ((this_00.objectValue)->properties)._M_h._M_element_count =
         (size_type)
         (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((this_00.objectValue)->properties)._M_h._M_rehash_policy,
               &(this->stackFrame).
                super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    v.field_1.integerValue = this_00.integerValue;
    v._0_8_ = 6;
    pushOpStack(this,v);
    peVar6 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar6->programCounter = peVar6->programCounter + 1;
    return;
  }
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pSVar7);
  if ((StackFrame *)local_50._0_8_ != pSVar7) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

void runtime::VirtualMachine::MakeFn() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->functions.size()) {
    this->panic("Index out of bounds in MakeFn");
    return;
  }

  runtime::Function* fn = this->heap.NewFunction();
  fn->fn = &this->file->functions.at(index);
  fn->captures.clear();

  for (const auto& closure : fn->fn->closures) {
    fn->captures.push_back(this->loadClosure(closure));
  }

  fn->scopeOuter = this->stackFrame;

  this->pushFunction(fn);

  this->advance();
}